

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraHot.c
# Opt level: O1

void Fra_OneHotEstimateCoverage(Fra_Man_t *p,Vec_Int_t *vOneHots)

{
  uint *puVar1;
  uint uVar2;
  int *piVar3;
  int iVar4;
  uint uVar5;
  undefined8 *__ptr;
  void *pvVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  undefined8 *puVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  timespec ts;
  long local_48;
  timespec local_40;
  
  uVar15 = p->pManAig->nRegs;
  lVar16 = (long)(int)uVar15;
  iVar4 = clock_gettime(3,&local_40);
  if (iVar4 < 0) {
    local_48 = 1;
  }
  else {
    lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    local_48 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  __ptr = (undefined8 *)malloc((lVar16 + 1U) * 0x10000 + lVar16 * 8 + 8);
  if (-1 < (int)uVar15) {
    pvVar6 = __ptr + lVar16 + 1;
    uVar7 = lVar16 + 1U & 0xffffffff;
    puVar10 = __ptr;
    do {
      *puVar10 = pvVar6;
      puVar10 = puVar10 + 1;
      pvVar6 = (void *)((long)pvVar6 + 0x10000);
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  Aig_ManRandom(1);
  if (0 < (int)uVar15) {
    lVar9 = 0;
    do {
      lVar14 = __ptr[lVar9];
      lVar12 = 0;
      do {
        uVar5 = Aig_ManRandom(0);
        *(uint *)(lVar14 + lVar12 * 4) = uVar5;
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0x4000);
      lVar9 = lVar9 + 1;
    } while (lVar9 != lVar16);
  }
  if ((int)uVar15 < 0) {
LAB_00903f86:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  pvVar6 = (void *)__ptr[lVar16];
  iVar11 = 0;
  memset(pvVar6,0,0x10000);
  iVar4 = vOneHots->nSize;
  if (0 < iVar4) {
    piVar3 = vOneHots->pArray;
    uVar7 = 0;
    do {
      if ((long)iVar4 <= (long)(uVar7 | 1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar5 = piVar3[uVar7];
      uVar2 = piVar3[uVar7 | 1];
      if (uVar5 != 0 || uVar2 != 0) {
        uVar8 = ~uVar5;
        if (0 < (int)uVar5) {
          uVar8 = uVar5 - 1;
        }
        if (uVar15 < uVar8) goto LAB_00903f86;
        uVar13 = ~uVar2;
        if (0 < (int)uVar2) {
          uVar13 = uVar2 - 1;
        }
        if (uVar15 < uVar13) goto LAB_00903f86;
        lVar16 = __ptr[uVar8];
        lVar9 = __ptr[uVar13];
        if ((int)(uVar5 & uVar2) < 0) {
          lVar14 = 0;
          do {
            puVar1 = (uint *)((long)pvVar6 + lVar14 * 4);
            *puVar1 = *puVar1 | *(uint *)(lVar9 + lVar14 * 4) & *(uint *)(lVar16 + lVar14 * 4);
            lVar14 = lVar14 + 1;
          } while (lVar14 != 0x4000);
        }
        else if ((int)uVar5 < 0) {
          lVar14 = 0;
          do {
            puVar1 = (uint *)((long)pvVar6 + lVar14 * 4);
            *puVar1 = *puVar1 | ~*(uint *)(lVar9 + lVar14 * 4) & *(uint *)(lVar16 + lVar14 * 4);
            lVar14 = lVar14 + 1;
          } while (lVar14 != 0x4000);
        }
        else {
          if (-1 < (int)uVar2) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraHot.c"
                          ,0x175,"void Fra_OneHotEstimateCoverage(Fra_Man_t *, Vec_Int_t *)");
          }
          lVar14 = 0;
          do {
            puVar1 = (uint *)((long)pvVar6 + lVar14 * 4);
            *puVar1 = *puVar1 | ~*(uint *)(lVar16 + lVar14 * 4) & *(uint *)(lVar9 + lVar14 * 4);
            lVar14 = lVar14 + 1;
          } while (lVar14 != 0x4000);
        }
      }
      uVar7 = uVar7 + 2;
      iVar4 = vOneHots->nSize;
    } while ((int)uVar7 < iVar4);
  }
  lVar16 = 0;
  do {
    uVar15 = *(uint *)((long)pvVar6 + lVar16 * 4);
    uVar15 = (uVar15 >> 1 & 0x55555555) + (uVar15 & 0x55555555);
    uVar15 = (uVar15 >> 2 & 0x33333333) + (uVar15 & 0x33333333);
    uVar15 = (uVar15 >> 4 & 0x7070707) + (uVar15 & 0x7070707);
    uVar15 = (uVar15 >> 8 & 0xf000f) + (uVar15 & 0xf000f);
    iVar11 = iVar11 + (uVar15 >> 0x10) + (uVar15 & 0xffff);
    lVar16 = lVar16 + 1;
  } while (lVar16 != 0x4000);
  if (__ptr != (undefined8 *)0x0) {
    free(__ptr);
  }
  printf("Care states ratio = %f. ",(double)(int)(0x80000U - iVar11) * 1.9073486328125e-06);
  iVar4 = 0xa10020;
  printf("(%d out of %d patterns)  ",(ulong)(0x80000U - iVar11),0x80000);
  Abc_Print(iVar4,"%s =","Time");
  iVar11 = 3;
  iVar4 = clock_gettime(3,&local_40);
  if (iVar4 < 0) {
    lVar16 = -1;
  }
  else {
    lVar16 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  Abc_Print(iVar11,"%9.2f sec\n",(double)(lVar16 + local_48) / 1000000.0);
  return;
}

Assistant:

void Fra_OneHotEstimateCoverage( Fra_Man_t * p, Vec_Int_t * vOneHots )
{
    int nSimWords = (1<<14);
    int nRegs = Aig_ManRegNum(p->pManAig);
    Vec_Ptr_t * vSimInfo;
    unsigned * pSim1, * pSim2, * pSimTot;
    int i, w, Out1, Out2, nCovered, Counter = 0;
    abctime clk = Abc_Clock();

    // generate random sim-info at register outputs
    vSimInfo = Vec_PtrAllocSimInfo( nRegs + 1, nSimWords );
//    srand( 0xAABBAABB );
    Aig_ManRandom(1);
    for ( i = 0; i < nRegs; i++ )
    {
        pSim1 = (unsigned *)Vec_PtrEntry( vSimInfo, i );
        for ( w = 0; w < nSimWords; w++ )
            pSim1[w] = Fra_ObjRandomSim();
    }
    pSimTot = (unsigned *)Vec_PtrEntry( vSimInfo, nRegs );

    // collect simulation info
    memset( pSimTot, 0, sizeof(unsigned) * nSimWords );
    for ( i = 0; i < Vec_IntSize(vOneHots); i += 2 )
    {
        Out1 = Vec_IntEntry( vOneHots, i );
        Out2 = Vec_IntEntry( vOneHots, i+1 );
        if ( Out1 == 0 && Out2 == 0 )
            continue;
//printf( "(%c%d,%c%d) ", 
//Fra_LitSign(Out1)? '-': '+', Fra_LitReg(Out1), 
//Fra_LitSign(Out2)? '-': '+', Fra_LitReg(Out2) ); 
        Counter++;
        pSim1 = (unsigned *)Vec_PtrEntry( vSimInfo, Fra_LitReg(Out1) );
        pSim2 = (unsigned *)Vec_PtrEntry( vSimInfo, Fra_LitReg(Out2) );
        if ( Fra_LitSign(Out1) && Fra_LitSign(Out2) )
            for ( w = 0; w < nSimWords; w++ )
                pSimTot[w] |=  pSim1[w] &  pSim2[w];
        else if ( Fra_LitSign(Out1) )
            for ( w = 0; w < nSimWords; w++ )
                pSimTot[w] |=  pSim1[w] & ~pSim2[w];
        else if ( Fra_LitSign(Out2) )
            for ( w = 0; w < nSimWords; w++ )
                pSimTot[w] |= ~pSim1[w] &  pSim2[w];
        else
            assert( 0 );
    }
//printf( "\n" );
    // count the total number of patterns contained in the don't-care
    nCovered = 0;
    for ( w = 0; w < nSimWords; w++ )
        nCovered += Aig_WordCountOnes( pSimTot[w] );
    Vec_PtrFree( vSimInfo );
    // print the result
    printf( "Care states ratio = %f. ", 1.0 * (nSimWords * 32 - nCovered) / (nSimWords * 32) );
    printf( "(%d out of %d patterns)  ", nSimWords * 32 - nCovered, nSimWords * 32 );
    ABC_PRT( "Time", Abc_Clock() - clk );
}